

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::setVariablesToBoundForForcingRow(HPresolve *this,int row,bool isLower)

{
  int *piVar1;
  iterator *piVar2;
  double dVar3;
  int iVar4;
  pointer piVar5;
  _Elt_pointer pcVar6;
  pointer piVar7;
  bool bVar8;
  ostream *poVar9;
  long *plVar10;
  pointer pdVar11;
  undefined7 in_register_00000011;
  pointer pdVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> bnds;
  int local_90;
  allocator_type local_89;
  undefined8 local_88;
  pointer local_80 [3];
  undefined4 local_64;
  deque<change,std::allocator<change>> *local_60;
  deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
  *local_58;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_64 = (undefined4)CONCAT71(in_register_00000011,isLower);
  local_90 = row;
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Forcing row ",0x10);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," removed. Following variables too:   nzRow=",0x2b);
    uVar13 = (ulong)local_90;
    piVar5 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar13)
    goto LAB_00143ce2;
    plVar10 = (long *)std::ostream::operator<<(poVar9,piVar5[uVar13]);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
  }
  uVar13 = (ulong)local_90;
  piVar5 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar13 < (ulong)((long)(this->super_HPreData).flagRow.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar5 >> 2)) {
    piVar5[uVar13] = 0;
    local_88 = (double)CONCAT44(local_90,4);
    local_80[0] = (pointer)((ulong)local_80[0] & 0xffffffff00000000);
    pcVar6 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pcVar6 == *(_Elt_pointer *)
                   ((long)&(this->super_HPreData).chng.c.
                           super__Deque_base<change,_std::allocator<change>_>._M_impl.
                           super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                ((deque<change,std::allocator<change>> *)&(this->super_HPreData).chng,
                 (change *)&local_88);
    }
    else {
      pcVar6->col = 0;
      *(double *)pcVar6 = local_88;
      piVar2 = &(this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar2->_M_cur = piVar2->_M_cur + 1;
    }
    uVar14 = (ulong)local_90;
    piVar5 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = uVar14;
    if (uVar14 < (ulong)((long)(this->super_HPreData).ARstart.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar5 >> 2)) {
      uVar13 = (long)local_90 + 1;
      piVar7 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar13 < (ulong)((long)(this->super_HPreData).ARstart.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar7 >> 2)) {
        iVar4 = piVar5[uVar14];
        uVar14 = (ulong)iVar4;
        if (iVar4 < piVar7[(long)local_90 + 1]) {
          local_58 = (deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                      *)&(this->super_HPreData).oldBounds;
          local_60 = (deque<change,std::allocator<change>> *)&(this->super_HPreData).chng;
          do {
            piVar5 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = uVar14;
            if ((ulong)((long)(this->super_HPreData).ARindex.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar14)
            goto LAB_00143ce2;
            iVar4 = piVar5[uVar14];
            uVar15 = (ulong)iVar4;
            piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = uVar15;
            if ((ulong)((long)(this->super_HPreData).flagCol.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar15)
            goto LAB_00143ce2;
            if (piVar5[uVar15] != 0) {
              pdVar11 = (this->super_HPreData).ARvalue.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar13 = uVar14;
              if ((ulong)((long)(this->super_HPreData).ARvalue.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar14)
              goto LAB_00143ce2;
              dVar3 = pdVar11[uVar14];
              bVar8 = dVar3 <= 0.0;
              if ((char)local_64 != '\0') {
                bVar8 = 0.0 <= dVar3;
              }
              if (bVar8) {
                pdVar11 = (this->super_HPreData).colLower.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar12 = (this->super_HPreData).colLower.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              else {
                pdVar11 = (this->super_HPreData).colUpper.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar12 = (this->super_HPreData).colUpper.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              uVar13 = uVar15;
              if ((ulong)((long)pdVar12 - (long)pdVar11 >> 3) <= uVar15) goto LAB_00143ce2;
              local_50 = pdVar11[uVar15];
              setPrimalValue(this,iVar4,local_50);
              pdVar11 = (this->super_HPreData).colCost.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (((ulong)((long)(this->super_HPreData).colCost.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar15)
                 || (pdVar12 = (this->super_HPreData).valueColDual.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start,
                    (ulong)((long)(this->super_HPreData).valueColDual.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar12 >> 3) <= uVar15)
                 ) goto LAB_00143ce2;
              pdVar12[uVar15] = pdVar11[uVar15];
              pdVar11 = (this->super_HPreData).colLower.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->super_HPreData).colLower.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar15)
              goto LAB_00143ce2;
              local_88 = pdVar11[uVar15];
              pdVar11 = (this->super_HPreData).colUpper.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->super_HPreData).colUpper.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar15)
              goto LAB_00143ce2;
              local_80[0] = (pointer)pdVar11[uVar15];
              __l._M_len = 2;
              __l._M_array = (iterator)&local_88;
              std::vector<double,_std::allocator<double>_>::vector(&local_48,__l,&local_89);
              local_88._0_4_ = iVar4;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)local_80,&local_48);
              std::
              deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
              ::emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                        (local_58,(pair<int,_std::vector<double,_std::allocator<double>_>_> *)
                                  &local_88);
              if (local_80[0] != (pointer)0x0) {
                operator_delete(local_80[0]);
              }
              local_88 = 1.03753785626662e-322;
              local_80[0] = (pointer)CONCAT44(local_80[0]._4_4_,iVar4);
              pcVar6 = (this->super_HPreData).chng.c.
                       super__Deque_base<change,_std::allocator<change>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur;
              if (pcVar6 == *(_Elt_pointer *)
                             ((long)&(this->super_HPreData).chng.c.
                                     super__Deque_base<change,_std::allocator<change>_>._M_impl.
                                     super__Deque_impl_data._M_finish + 0x10) + -1) {
                std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                          (local_60,(change *)&local_88);
              }
              else {
                pcVar6->col = iVar4;
                pcVar6->type = 0x15;
                pcVar6->row = 0;
                piVar2 = &(this->super_HPreData).chng.c.
                          super__Deque_base<change,_std::allocator<change>_>._M_impl.
                          super__Deque_impl_data._M_finish;
                piVar2->_M_cur = piVar2->_M_cur + 1;
              }
              if (0 < this->iPrint) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"PR:      Variable  ",0x13);
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," := ",4);
                poVar9 = std::ostream::_M_insert<double>(local_50);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
              }
              piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4;
              *piVar1 = *piVar1 + 1;
              if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
              }
            }
            uVar13 = (long)local_90 + 1;
            piVar5 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->super_HPreData).ARstart.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= uVar13)
            goto LAB_00143ce2;
            uVar14 = uVar14 + 1;
          } while ((long)uVar14 < (long)piVar5[(long)local_90 + 1]);
        }
        uVar13 = (ulong)local_90;
        piVar5 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar13 < (ulong)((long)(this->super_HPreData).nzRow.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar5 >> 2)) {
          if (piVar5[uVar13] == 1) {
            std::__cxx11::list<int,_std::allocator<int>_>::remove(&this->singRow,(char *)&local_90);
          }
          piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 4;
          *piVar1 = *piVar1 + 1;
          return;
        }
      }
    }
  }
LAB_00143ce2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13);
}

Assistant:

void HPresolve::setVariablesToBoundForForcingRow(const int row, const bool isLower) {
	int k, col;
	if (iPrint > 0)
		cout << "PR: Forcing row " << row
				<< " removed. Following variables too:   nzRow=" << nzRow.at(row)
				<< endl;

	flagRow.at(row) = 0;
	addChange(FORCING_ROW, row, 0);
	k = ARstart.at(row);
	while (k < ARstart.at(row + 1)) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			double value;
			if ((ARvalue.at(k) < 0 && isLower)
					|| (ARvalue.at(k) > 0 && !isLower))
				value = colUpper.at(col);
			else
				value = colLower.at(col);

			setPrimalValue(col, value);
			valueColDual.at(col) = colCost.at(col);
			vector<double> bnds({colLower.at(col), colUpper.at(col)});
			oldBounds.push(make_pair(col, bnds));
			addChange(FORCING_ROW_VARIABLE, 0, col);

			if (iPrint > 0)
				cout << "PR:      Variable  " << col << " := " << value << endl;
			countRemovedCols[FORCING_ROW]++;
		}
		++k;
	}

	if (nzRow.at(row) == 1)
		singRow.remove(row);

	countRemovedRows[FORCING_ROW]++;
}